

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O3

void bignum_from_string(bn *n,char *str,int nbytes)

{
  ulong uVar1;
  long in_FS_OFFSET;
  uint32_t tmp;
  uint32_t local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == (bn *)0x0) {
    __assert_fail("n && \"n is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,100,"void bignum_from_string(struct bn *, char *, int)");
  }
  if (str == (char *)0x0) {
    __assert_fail("str && \"str is null\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x65,"void bignum_from_string(struct bn *, char *, int)");
  }
  if (nbytes < 1) {
    __assert_fail("nbytes > 0 && \"nbytes must be positive\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x66,"void bignum_from_string(struct bn *, char *, int)");
  }
  if ((nbytes & 1U) == 0) {
    if ((nbytes & 6U) != 0) {
      __assert_fail("(nbytes % (sizeof(uint32_t) * 2)) == 0 && \"string length must be a multiple of (sizeof(DTYPE) * 2) characters\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                    ,0x68,"void bignum_from_string(struct bn *, char *, int)");
    }
    n->array[0x1c] = 0;
    n->array[0x1d] = 0;
    n->array[0x1e] = 0;
    n->array[0x1f] = 0;
    n->array[0x18] = 0;
    n->array[0x19] = 0;
    n->array[0x1a] = 0;
    n->array[0x1b] = 0;
    n->array[0x14] = 0;
    n->array[0x15] = 0;
    n->array[0x16] = 0;
    n->array[0x17] = 0;
    n->array[0x10] = 0;
    n->array[0x11] = 0;
    n->array[0x12] = 0;
    n->array[0x13] = 0;
    n->array[0xc] = 0;
    n->array[0xd] = 0;
    n->array[0xe] = 0;
    n->array[0xf] = 0;
    n->array[8] = 0;
    n->array[9] = 0;
    n->array[10] = 0;
    n->array[0xb] = 0;
    n->array[4] = 0;
    n->array[5] = 0;
    n->array[6] = 0;
    n->array[7] = 0;
    n->array[0] = 0;
    n->array[1] = 0;
    n->array[2] = 0;
    n->array[3] = 0;
    if (7 < (uint)nbytes) {
      uVar1 = (ulong)(uint)nbytes + 8;
      do {
        local_34 = 0;
        __isoc99_sscanf(str + (uVar1 - 0x10),"%8x",&local_34);
        n->array[0] = local_34;
        uVar1 = uVar1 - 8;
        n = (bn *)((long)n + 4);
      } while (0xf < uVar1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("(nbytes & 1) == 0 && \"string format must be in hex -> equal number of bytes\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                ,0x67,"void bignum_from_string(struct bn *, char *, int)");
}

Assistant:

void bignum_from_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");
  require((nbytes % (sizeof(DTYPE) * 2)) == 0, "string length must be a multiple of (sizeof(DTYPE) * 2) characters");
  
  bignum_init(n);

  DTYPE tmp;                        /* DTYPE is defined in bn.h - uint{8,16,32,64}_t */
  int i = nbytes - (2 * WORD_SIZE); /* index into string */
  int j = 0;                        /* index into array */

  /* reading last hex-byte "MSB" from string first -> big endian */
  /* MSB ~= most significant byte / block ? :) */
  while (i >= 0)
  {
    tmp = 0;
    sscanf(&str[i], SSCANF_FORMAT_STR, &tmp);
    n->array[j] = tmp;
    i -= (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) back in the string. */
    j += 1;               /* step one element forward in the array. */
  }
}